

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool __thiscall leveldb::VersionSet::ReuseManifest(VersionSet *this,string *dscname,string *dscbase)

{
  WritableFile **ppWVar1;
  Logger *info_log;
  bool bVar2;
  Writer *this_00;
  bool bVar3;
  Status r;
  uint64_t manifest_size;
  uint64_t manifest_number;
  FileType manifest_type;
  Status local_70;
  ulong local_68;
  void *local_60;
  uint64_t local_58;
  FileType local_4c;
  string local_48;
  
  if (this->options_->reuse_logs == true) {
    bVar2 = ParseFileName(dscbase,&local_58,&local_4c);
    bVar3 = true;
    if ((local_4c == kDescriptorFile && bVar2) &&
       ((*this->env_->_vptr_Env[0xb])(&local_60,this->env_,dscname,&local_68),
       local_60 == (void *)0x0)) {
      bVar3 = this->options_->max_file_size <= local_68;
    }
    if ((local_4c == kDescriptorFile && bVar2) && (local_60 != (void *)0x0)) {
      operator_delete__(local_60);
    }
    if (!bVar3) {
      if (this->descriptor_file_ != (WritableFile *)0x0) {
        __assert_fail("descriptor_file_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                      ,0x402,
                      "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                     );
      }
      if (this->descriptor_log_ == (Writer *)0x0) {
        ppWVar1 = &this->descriptor_file_;
        (*this->env_->_vptr_Env[5])(&local_70,this->env_,dscname,ppWVar1);
        bVar3 = local_70.state_ == (char *)0x0;
        info_log = this->options_->info_log;
        if (bVar3) {
          Log(info_log,"Reusing MANIFEST %s\n",(dscname->_M_dataplus)._M_p);
          this_00 = (Writer *)operator_new(0x20);
          log::Writer::Writer(this_00,*ppWVar1,local_68);
          this->descriptor_log_ = this_00;
          this->manifest_file_number_ = local_58;
        }
        else {
          Status::ToString_abi_cxx11_(&local_48,&local_70);
          Log(info_log,"Reuse MANIFEST: %s\n",local_48._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
          if (*ppWVar1 != (WritableFile *)0x0) {
            __assert_fail("descriptor_file_ == nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                          ,0x407,
                          "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                         );
          }
        }
        if (local_70.state_ == (char *)0x0) {
          return bVar3;
        }
        operator_delete__(local_70.state_);
        return bVar3;
      }
      __assert_fail("descriptor_log_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                    ,0x403,
                    "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                   );
    }
  }
  return false;
}

Assistant:

bool VersionSet::ReuseManifest(const std::string& dscname,
                               const std::string& dscbase) {
  if (!options_->reuse_logs) {
    return false;
  }
  FileType manifest_type;
  uint64_t manifest_number;
  uint64_t manifest_size;
  if (!ParseFileName(dscbase, &manifest_number, &manifest_type) ||
      manifest_type != kDescriptorFile ||
      !env_->GetFileSize(dscname, &manifest_size).ok() ||
      // Make new compacted MANIFEST if old one is too big
      manifest_size >= TargetFileSize(options_)) {
    return false;
  }

  assert(descriptor_file_ == nullptr);
  assert(descriptor_log_ == nullptr);
  Status r = env_->NewAppendableFile(dscname, &descriptor_file_);
  if (!r.ok()) {
    Log(options_->info_log, "Reuse MANIFEST: %s\n", r.ToString().c_str());
    assert(descriptor_file_ == nullptr);
    return false;
  }

  Log(options_->info_log, "Reusing MANIFEST %s\n", dscname.c_str());
  descriptor_log_ = new log::Writer(descriptor_file_, manifest_size);
  manifest_file_number_ = manifest_number;
  return true;
}